

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::AddPubkeyHashSign
          (RawTransactionResponseStruct *__return_storage_ptr__,
          AddPubkeyHashSignRequestStruct *request)

{
  AddPubkeyHashSignRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  AddPubkeyHashSignRequestStruct *pAStack_18;
  anon_class_1_0_00000001 call_func;
  AddPubkeyHashSignRequestStruct *request_local;
  RawTransactionResponseStruct *result;
  
  local_1a = 0;
  pAStack_18 = request;
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  this = pAStack_18;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddPubkeyHashSignRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::AddPubkeyHashSign(cfd::js::api::AddPubkeyHashSignRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddPubkeyHashSignRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"AddPubkeyHashSign",&local_129);
  ExecuteStructApi<cfd::js::api::AddPubkeyHashSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((RawTransactionResponseStruct *)(local_108 + 0x20),(api *)this,
             (AddPubkeyHashSignRequestStruct *)local_108,&local_128,in_R8);
  RawTransactionResponseStruct::operator=
            (__return_storage_ptr__,(RawTransactionResponseStruct *)(local_108 + 0x20));
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&)>
  ::~function((function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct ElementsTransactionStructApi::AddPubkeyHashSign(
    const AddPubkeyHashSignRequestStruct& request) {
  auto call_func = [](const AddPubkeyHashSignRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    Pubkey pubkey(request.txin.pubkey);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sign_param.sighash_type,
        request.txin.sign_param.sighash_anyone_can_pay,
        request.txin.sign_param.sighash_rangeproof);
    SignParameter signature(
        ByteData(request.txin.sign_param.hex),
        request.txin.sign_param.der_encode, sighashtype);

    ctx.AddPubkeyHashSign(outpoint, signature, pubkey, addr_type);
    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      AddPubkeyHashSignRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}